

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementType::IfcElementType(IfcElementType *this,void **vtt)

{
  void *pvVar1;
  
  IfcTypeProduct::IfcTypeProduct(&this->super_IfcTypeProduct,vtt + 1);
  pvVar1 = vtt[0x17];
  *(void **)&(this->super_IfcTypeProduct).field_0x148 = pvVar1;
  *(void **)(&(this->super_IfcTypeProduct).field_0x148 + *(long *)((long)pvVar1 + -0x18)) =
       vtt[0x18];
  *(undefined8 *)&(this->super_IfcTypeProduct).field_0x150 = 0;
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject = pvVar1;
  *(void **)(&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x0 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x19];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = vtt[0x1a];
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = vtt[0x1c];
  *(void **)&(this->super_IfcTypeProduct).field_0x148 = vtt[0x1d];
  *(undefined1 **)&(this->super_IfcTypeProduct).field_0x158 = &this->field_0x168;
  *(undefined8 *)&this->field_0x160 = 0;
  this->field_0x168 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcElementType() : Object("IfcElementType") {}